

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# additional.cpp
# Opt level: O1

BN * gcdEuclidean(BN *__return_storage_ptr__,BN *a,BN *b)

{
  bool bVar1;
  BN local_38;
  
  bVar1 = BN::is0(b);
  while (!bVar1) {
    BN::operator%(&local_38,a,b);
    BN::operator=(a,&local_38);
    if (local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    BN::swap(a,b);
    bVar1 = BN::is0(b);
  }
  BN::BN(__return_storage_ptr__,a);
  return __return_storage_ptr__;
}

Assistant:

BN gcdEuclidean(BN a,BN b)
{
    while(!b.is0()) {
        a = a % b;
        a.swap(b);
    }
    return a;
}